

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O3

array<pbrt::Point3<float>,_4> * __thiscall
pbrt::CubicBezierControlPoints<pbrt::Point3<float>>
          (array<pbrt::Point3<float>,_4> *__return_storage_ptr__,pbrt *this,
          span<const_pbrt::Point3<float>_> cp,Float uMin,Float uMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  fVar1 = *(float *)(this + 0x14);
  fVar2 = *(float *)(this + 8);
  fVar3 = *(float *)(this + 0x20);
  fVar4 = *(float *)(this + 0x2c);
  fVar23 = 1.0 - uMin;
  fVar6 = fVar23 * fVar2 + fVar1 * uMin;
  fVar7 = fVar3 * uMin + fVar23 * fVar1;
  fVar8 = fVar4 * uMin + fVar3 * fVar23;
  fVar20 = fVar7 * uMin + fVar23 * fVar6;
  fVar22 = fVar8 * uMin + fVar7 * fVar23;
  auVar14._4_4_ = fVar23;
  auVar14._0_4_ = fVar23;
  auVar14._8_4_ = fVar23;
  auVar14._12_4_ = fVar23;
  auVar16._4_4_ = uMin;
  auVar16._0_4_ = uMin;
  auVar16._8_4_ = uMin;
  auVar16._12_4_ = uMin;
  fVar12 = 1.0 - uMax;
  fVar9 = fVar3 * uMax + fVar12 * fVar1;
  fVar27 = (float)*(undefined8 *)(this + 0x24);
  fVar28 = (float)((ulong)*(undefined8 *)(this + 0x24) >> 0x20);
  auVar18._4_4_ = uMax;
  auVar18._0_4_ = uMax;
  auVar18._8_4_ = uMax;
  auVar18._12_4_ = uMax;
  fVar25 = (float)*(undefined8 *)(this + 0x18);
  fVar26 = (float)((ulong)*(undefined8 *)(this + 0x18) >> 0x20);
  fVar19 = (float)*(undefined8 *)(this + 0xc);
  fVar21 = (float)((ulong)*(undefined8 *)(this + 0xc) >> 0x20);
  fVar10 = (float)*(undefined8 *)this;
  fVar11 = (float)((ulong)*(undefined8 *)this >> 0x20);
  fVar29 = fVar23 * fVar10 + fVar19 * uMin;
  fVar30 = fVar23 * fVar11 + fVar21 * uMin;
  fVar31 = fVar23 * 0.0 + uMin * 0.0;
  fVar32 = fVar23 * 0.0 + uMin * 0.0;
  auVar33._0_4_ = fVar19 * fVar23 + fVar25 * uMin;
  auVar33._4_4_ = fVar21 * fVar23 + fVar26 * uMin;
  auVar33._8_4_ = fVar23 * 0.0 + uMin * 0.0;
  auVar33._12_4_ = fVar23 * 0.0 + uMin * 0.0;
  auVar34._0_4_ = fVar25 * fVar23 + fVar27 * uMin;
  auVar34._4_4_ = fVar26 * fVar23 + fVar28 * uMin;
  auVar34._8_4_ = fVar23 * 0.0 + uMin * 0.0;
  auVar34._12_4_ = fVar23 * 0.0 + uMin * 0.0;
  auVar36._0_4_ = fVar29 * fVar23;
  auVar36._4_4_ = fVar30 * fVar23;
  auVar36._8_4_ = fVar31 * fVar23;
  auVar36._12_4_ = fVar32 * fVar23;
  auVar13 = vmulps_avx512vl(auVar33,auVar16);
  auVar13 = vaddps_avx512vl(auVar36,auVar13);
  auVar14 = vmulps_avx512vl(auVar14,auVar33);
  auVar15 = vmulps_avx512vl(auVar34,auVar16);
  auVar14 = vaddps_avx512vl(auVar14,auVar15);
  auVar15 = vmulps_avx512vl(auVar14,auVar16);
  auVar17._0_4_ = auVar13._0_4_ * fVar23 + auVar15._0_4_;
  auVar17._4_4_ = auVar13._4_4_ * fVar23 + auVar15._4_4_;
  auVar17._8_4_ = auVar13._8_4_ * fVar23 + auVar15._8_4_;
  auVar17._12_4_ = auVar13._12_4_ * fVar23 + auVar15._12_4_;
  auVar14 = vmulps_avx512vl(auVar14,auVar18);
  uVar5 = vmovlps_avx(auVar17);
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar5 >> 0x20);
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.z =
       fVar22 * uMin + fVar20 * fVar23;
  auVar35._0_4_ = auVar13._0_4_ * fVar12 + auVar14._0_4_;
  auVar35._4_4_ = auVar13._4_4_ * fVar12 + auVar14._4_4_;
  auVar35._8_4_ = auVar13._8_4_ * fVar12 + auVar14._8_4_;
  auVar35._12_4_ = auVar13._12_4_ * fVar12 + auVar14._12_4_;
  uVar5 = vmovlps_avx(auVar35);
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar5 >> 0x20);
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.z =
       fVar22 * uMax + fVar12 * fVar20;
  fVar20 = fVar19 * fVar12 + fVar25 * uMax;
  fVar22 = fVar21 * fVar12 + fVar26 * uMax;
  fVar23 = fVar12 * 0.0 + uMax * 0.0;
  fVar24 = fVar12 * 0.0 + uMax * 0.0;
  auVar15._0_4_ =
       (fVar29 * fVar12 + auVar33._0_4_ * uMax) * fVar12 +
       (auVar33._0_4_ * fVar12 + auVar34._0_4_ * uMax) * uMax;
  auVar15._4_4_ =
       (fVar30 * fVar12 + auVar33._4_4_ * uMax) * fVar12 +
       (auVar33._4_4_ * fVar12 + auVar34._4_4_ * uMax) * uMax;
  auVar15._8_4_ =
       (fVar31 * fVar12 + auVar33._8_4_ * uMax) * fVar12 +
       (auVar33._8_4_ * fVar12 + auVar34._8_4_ * uMax) * uMax;
  auVar15._12_4_ =
       (fVar32 * fVar12 + auVar33._12_4_ * uMax) * fVar12 +
       (auVar33._12_4_ * fVar12 + auVar34._12_4_ * uMax) * uMax;
  uVar5 = vmovlps_avx(auVar15);
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar5 >> 0x20);
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.z =
       (fVar12 * fVar7 + fVar8 * uMax) * uMax + fVar12 * (fVar7 * uMax + fVar12 * fVar6);
  auVar13._0_4_ =
       fVar12 * (fVar20 * uMax + fVar12 * (fVar19 * uMax + fVar12 * fVar10)) +
       (fVar20 * fVar12 + (fVar25 * fVar12 + fVar27 * uMax) * uMax) * uMax;
  auVar13._4_4_ =
       fVar12 * (fVar22 * uMax + fVar12 * (fVar21 * uMax + fVar12 * fVar11)) +
       (fVar22 * fVar12 + (fVar26 * fVar12 + fVar28 * uMax) * uMax) * uMax;
  auVar13._8_4_ =
       fVar12 * (fVar23 * uMax + fVar12 * (uMax * 0.0 + fVar12 * 0.0)) +
       (fVar23 * fVar12 + (fVar12 * 0.0 + uMax * 0.0) * uMax) * uMax;
  auVar13._12_4_ =
       fVar12 * (fVar24 * uMax + fVar12 * (uMax * 0.0 + fVar12 * 0.0)) +
       (fVar24 * fVar12 + (fVar12 * 0.0 + uMax * 0.0) * uMax) * uMax;
  uVar5 = vmovlps_avx(auVar13);
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar5 >> 0x20);
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.z =
       fVar12 * (fVar9 * uMax + fVar12 * (fVar1 * uMax + fVar12 * fVar2)) +
       ((fVar12 * fVar3 + fVar4 * uMax) * uMax + fVar12 * fVar9) * uMax;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<P, 4> CubicBezierControlPoints(pstd::span<const P> cp,
                                                               Float uMin, Float uMax) {
    return {BlossomCubicBezier(cp, uMin, uMin, uMin),
            BlossomCubicBezier(cp, uMin, uMin, uMax),
            BlossomCubicBezier(cp, uMin, uMax, uMax),
            BlossomCubicBezier(cp, uMax, uMax, uMax)};
}